

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdNameMap.h
# Opt level: O0

void __thiscall
Rml::IdNameMap<Rml::PropertyId>::AddPair
          (IdNameMap<Rml::PropertyId> *this,PropertyId id,String *name)

{
  code *pcVar1;
  String *pSVar2;
  bool bVar3;
  size_type sVar4;
  reference this_00;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyId,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  local_40;
  byte local_21;
  String *pSStack_20;
  bool inserted;
  String *name_local;
  IdNameMap<Rml::PropertyId> *pIStack_10;
  PropertyId id_local;
  IdNameMap<Rml::PropertyId> *this_local;
  
  pSStack_20 = name;
  name_local._7_1_ = id;
  pIStack_10 = this;
  sVar4 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this);
  if (sVar4 <= id) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,(ulong)name_local._7_1_ + 1);
  }
  pSVar2 = pSStack_20;
  this_00 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this,(ulong)name_local._7_1_);
  ::std::__cxx11::string::operator=((string *)this_00,(string *)pSVar2);
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,Rml::PropertyId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::emplace<std::__cxx11::string_const&,Rml::PropertyId&>
            (&local_40,
             (Table<true,80ul,std::__cxx11::string,Rml::PropertyId,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)&this->reverse_map,pSStack_20,(PropertyId *)((long)&name_local + 7));
  local_21 = local_40.second & 1;
  if ((local_21 == 0) &&
     (bVar3 = Assert("RMLUI_ASSERT(inserted)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/IdNameMap.h"
                     ,0x3c), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return;
}

Assistant:

void AddPair(ID id, const String& name)
	{
		// Should only be used for defined IDs
		if ((size_t)id >= name_map.size())
			name_map.resize(1 + (size_t)id);
		name_map[(size_t)id] = name;
		bool inserted = reverse_map.emplace(name, id).second;
		RMLUI_ASSERT(inserted);
		(void)inserted;
	}